

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Object::writeTo(Object *this,BinaryWriter *binary)

{
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t in_RCX;
  void *in_RDX;
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int32_t local_7c;
  shared_ptr<pbrt::Shape> geom;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  BinaryWriter::write(binary,(int)this + 0x60,in_RDX,in_RCX);
  geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       (undefined4)
       ((ulong)((long)(this->shapes).
                      super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->shapes).
                     super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  BinaryWriter::write<int>
            (binary,(int *)&geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>);
  p_Var1 = &((this->shapes).
             super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var4 = &((this->shapes).
                  super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>; p_Var4 != p_Var1;
      p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>,p_Var4);
    std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Shape,void>
              (local_40,&geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>);
    local_7c = BinaryWriter::serialize(binary,(SP *)local_40);
    BinaryWriter::write<int>(binary,&local_7c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       (undefined4)
       ((ulong)((long)(this->lightSources).
                      super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->lightSources).
                     super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  BinaryWriter::write<int>(binary,(int *)&geom);
  p_Var2 = &((this->lightSources).
             super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var5 = &((this->lightSources).
                  super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>; p_Var5 != p_Var2
      ; p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *)&geom,p_Var5);
    std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::LightSource,void>
              (local_50,(__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *)&geom);
    local_7c = BinaryWriter::serialize(binary,(SP *)local_50);
    BinaryWriter::write<int>(binary,&local_7c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       (undefined4)
       ((ulong)((long)(this->instances).
                      super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->instances).
                     super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  BinaryWriter::write<int>(binary,(int *)&geom);
  p_Var3 = &((this->instances).
             super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var6 = &((this->instances).
                  super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>; p_Var6 != p_Var3;
      p_Var6 = p_Var6 + 1) {
    std::__shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *)&geom,p_Var6);
    std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Instance,void>
              (local_60,(__shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *)&geom);
    local_7c = BinaryWriter::serialize(binary,(SP *)local_60);
    BinaryWriter::write<int>(binary,&local_7c);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&geom.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return 2;
}

Assistant:

int Object::writeTo(BinaryWriter &binary) 
  {
    binary.write(name);
    binary.write((int32_t)shapes.size());
    for (auto geom : shapes) {
      binary.write(binary.serialize(geom));
    }
    binary.write((int32_t)lightSources.size());
    for (auto ls : lightSources) {
      binary.write(binary.serialize(ls));
    }
    binary.write((int32_t)instances.size());
    for (auto inst : instances) {
      binary.write(binary.serialize(inst));
    }
    return TYPE_OBJECT;
  }